

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O0

void de::cmdline::parseType<int>(char *src,int *dst)

{
  byte bVar1;
  invalid_argument *this;
  allocator<char> local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream str;
  int *dst_local;
  char *src_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,src,&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::istream::operator>>((istream *)local_198,dst);
  bVar1 = std::ios::bad();
  if (((bVar1 & 1) == 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) != 0)) {
    std::__cxx11::istringstream::~istringstream(local_198);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid integer literal");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseType<int> (const char* src, int* dst)
{
	std::istringstream str(src);
	str >> *dst;
	if (str.bad() || !str.eof())
		throw std::invalid_argument("invalid integer literal");
}